

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O1

void Js::ByteCodeDumper::
     DumpReg2Int1<Js::OpLayoutT_Reg2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
               (OpCode op,OpLayoutT_Reg2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *data,
               FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  ushort uVar1;
  code *pcVar2;
  int iVar3;
  bool bVar4;
  undefined4 *puVar5;
  ulong uVar6;
  ulong uVar7;
  undefined6 in_register_0000003a;
  char16_t *form;
  
  iVar3 = (int)CONCAT62(in_register_0000003a,op);
  if (iVar3 - 0xb4U < 2) {
    uVar1 = data->R0;
    uVar7 = (ulong)data->R1;
    uVar6 = (ulong)(uint)data->C1;
    form = L" R%d = R%d, %d";
  }
  else {
    if (iVar3 != 0xb8) {
      if (iVar3 == 0xdb) {
        Output::Print(L" R%d ",(ulong)data->R0);
        Output::Print(L"= func(");
        Output::Print(L" R%d ",(ulong)data->R1);
        Output::Print(L",");
        Output::Print(L" int:%d ",(ulong)(uint)data->C1);
        Output::Print(L")");
        return;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeDumper.cpp"
                                  ,0x226,"(false)","Unknown OpCode for OpLayoutReg2Int1");
      if (bVar4) {
        *puVar5 = 0;
        return;
      }
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    uVar1 = data->R0;
    uVar7 = (ulong)(uint)data->C1;
    uVar6 = (ulong)data->R1;
    form = L" R%d = [%d], R%d ";
  }
  Output::Print(form,(ulong)uVar1,uVar7,uVar6);
  return;
}

Assistant:

void ByteCodeDumper::DumpReg2Int1(OpCode op, const unaligned T* data, FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
         switch (op)
        {
            case OpCode::LdThis:
            case OpCode::ProfiledLdThis:
                Output::Print(_u(" R%d = R%d, %d"), data->R0, data->R1, data->C1);
                break;
            case OpCode::LdIndexedFrameDisplay:
                Output::Print(_u(" R%d = [%d], R%d "), data->R0, data->C1, data->R1);
                break;
            case OpCode::GetCachedFunc:
                DumpReg(data->R0);
                Output::Print(_u("= func("));
                DumpReg(data->R1);
                Output::Print(_u(","));
                DumpI4(data->C1);
                Output::Print(_u(")"));
                break;
            default:
                AssertMsg(false, "Unknown OpCode for OpLayoutReg2Int1");
                break;
        }
    }